

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O1

void __thiscall
cbtSortedOverlappingPairCache::cleanProxyFromPairs
          (cbtSortedOverlappingPairCache *this,cbtBroadphaseProxy *proxy,cbtDispatcher *dispatcher)

{
  CleanPairCallback cleanPairs;
  undefined **local_20;
  cbtBroadphaseProxy *local_18;
  cbtSortedOverlappingPairCache *local_10;
  cbtDispatcher *local_8;
  
  local_20 = &PTR__cbtOverlapCallback_00b6f5e0;
  local_18 = proxy;
  local_10 = this;
  local_8 = dispatcher;
  (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
    _vptr_cbtOverlappingPairCallback[0xc])(this,&local_20);
  return;
}

Assistant:

void cbtSortedOverlappingPairCache::cleanProxyFromPairs(cbtBroadphaseProxy* proxy, cbtDispatcher* dispatcher)
{
	class CleanPairCallback : public cbtOverlapCallback
	{
		cbtBroadphaseProxy* m_cleanProxy;
		cbtOverlappingPairCache* m_pairCache;
		cbtDispatcher* m_dispatcher;

	public:
		CleanPairCallback(cbtBroadphaseProxy* cleanProxy, cbtOverlappingPairCache* pairCache, cbtDispatcher* dispatcher)
			: m_cleanProxy(cleanProxy),
			  m_pairCache(pairCache),
			  m_dispatcher(dispatcher)
		{
		}
		virtual bool processOverlap(cbtBroadphasePair& pair)
		{
			if ((pair.m_pProxy0 == m_cleanProxy) ||
				(pair.m_pProxy1 == m_cleanProxy))
			{
				m_pairCache->cleanOverlappingPair(pair, m_dispatcher);
			}
			return false;
		}
	};

	CleanPairCallback cleanPairs(proxy, this, dispatcher);

	processAllOverlappingPairs(&cleanPairs, dispatcher);
}